

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmkicon.c
# Opt level: O1

Pixmap make_Xicon(DspInterface dsp)

{
  Display *pDVar1;
  int iVar2;
  int y_hot;
  int x_hot;
  uint height;
  uint width;
  XImage IconImage;
  
  memset(&IconImage,0,0x88);
  iVar2 = XReadBitmapFile(dsp->display_id,*(undefined8 *)(*(long *)(dsp->display_id + 0xe8) + 0x10),
                          iconpixmapfile,&width,&height,&IconPixmap,&x_hot,&y_hot);
  if (iVar2 == 1) {
    IconImage.width = 0x58;
    IconImage.height = 0x3a;
    IconImage.xoffset = 0;
    IconImage.format = 0;
    IconImage.data = (char *)Lisp_icon;
    IconImage.byte_order = 0;
    IconImage.bitmap_unit = 8;
    IconImage.bitmap_bit_order = 1;
    IconImage.bitmap_pad = 0;
    IconImage.depth = 1;
    IconImage.bytes_per_line = 0xb;
    pDVar1 = dsp->display_id;
    IconPixmap = XCreatePixmap(pDVar1,dsp->LispWindow,0x58,0x3a,
                               *(undefined4 *)
                                (*(long *)(pDVar1 + 0xe8) + 0x38 +
                                (long)*(int *)(pDVar1 + 0xe0) * 0x80));
    XPutImage(dsp->display_id,IconPixmap,dsp->Copy_GC,&IconImage,0,0,0,0,0x58,0x3a);
  }
  else if (iVar2 == 2) {
    make_Xicon_cold_2();
  }
  else if (iVar2 == 3) {
    make_Xicon_cold_1();
  }
  return IconPixmap;
}

Assistant:

Pixmap make_Xicon(DspInterface dsp)
{
  unsigned int width, height;
  int value, x_hot, y_hot;
  XImage IconImage = {0};


#ifdef TRACE
  printf("In make_Xicon().\n");
#endif
  value = XReadBitmapFile(dsp->display_id, RootWindow(dsp->display_id, 0), iconpixmapfile, &width,
                          &height, &IconPixmap, &x_hot, &y_hot);
  if (value == BitmapOpenFailed) {
    IconImage.width = Lisp_icon_width;
    IconImage.height = Lisp_icon_height;
    IconImage.xoffset = 0;
    IconImage.format = XYBitmap;
    IconImage.data = (char *)Lisp_icon;
#if defined(BYTESWAP)
    IconImage.byte_order = LSBFirst;
#else  /* BYTESWAP */
    IconImage.byte_order = MSBFirst;
#endif /* BYTESWAP */
    IconImage.bitmap_unit = 8;
    IconImage.bitmap_pad = 0;
    IconImage.depth = 1;
    IconImage.bytes_per_line = Lisp_icon_width / 8;
#if defined(X_ICON_IN_X_BITMAP_FORMAT)
    IconImage.bitmap_bit_order = LSBFirst;
#else
    IconImage.bitmap_bit_order = MSBFirst;
#endif

    IconPixmap = XCreatePixmap(
        dsp->display_id, dsp->LispWindow, Lisp_icon_width, Lisp_icon_height,
        (unsigned)DefaultDepthOfScreen(ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id))));

    XPutImage(dsp->display_id, IconPixmap, dsp->Copy_GC, &IconImage, 0, 0, 0, 0, Lisp_icon_width,
              Lisp_icon_height);

  } else if (value == BitmapFileInvalid)
    (void)fprintf(stderr, "Iconpixmapfile %s contains invalid bitmap data\n", iconpixmapfile);
  else if (value == BitmapNoMemory)
    (void)fprintf(stderr, "Not enough memory to allocate icon pixmap\n");
  return (IconPixmap);
}